

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O2

int dwarf_bitoffset(Dwarf_Die die,Dwarf_Half *attribute,Dwarf_Unsigned *ret_offset,
                   Dwarf_Error *error)

{
  Dwarf_Half DVar1;
  int iVar2;
  Dwarf_Unsigned luns;
  
  luns = 0;
  iVar2 = _dwarf_die_attr_unsigned_constant(die,0x6b,&luns,error);
  if (iVar2 == 0) {
    DVar1 = 0x6b;
  }
  else {
    if (iVar2 != -1) {
      return iVar2;
    }
    iVar2 = _dwarf_die_attr_unsigned_constant(die,0xc,&luns,error);
    if (iVar2 != 0) {
      return iVar2;
    }
    DVar1 = 0xc;
  }
  *attribute = DVar1;
  *ret_offset = luns;
  return 0;
}

Assistant:

int
dwarf_bitoffset(Dwarf_Die die,
    Dwarf_Half     *attribute,
    Dwarf_Unsigned *ret_offset,
    Dwarf_Error    *error)
{
    Dwarf_Unsigned luns = 0;
    int res = 0;
    /* DWARF4,5 case */
    res = _dwarf_die_attr_unsigned_constant(die,
        DW_AT_data_bit_offset, &luns, error);
    if (res == DW_DLV_NO_ENTRY) {
        /* DWARF2, DWARF3 case. */
        res = _dwarf_die_attr_unsigned_constant(die,
            DW_AT_bit_offset, &luns, error);
        if (res == DW_DLV_OK) {
            *attribute = DW_AT_bit_offset;
            *ret_offset = luns;
            return DW_DLV_OK;
        }
    } else if (res == DW_DLV_OK) {
        *attribute = DW_AT_data_bit_offset;
        *ret_offset = luns;
        return DW_DLV_OK;
    } else { /* fall to return */ }
    return res;
}